

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetephem.cpp
# Opt level: O1

void PrintEphemeris(CEObservation *obs,double *duration,double *step_size)

{
  double dVar1;
  double dVar2;
  CEDate *pCVar3;
  long lVar4;
  CEObservation *pCVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  int iVar10;
  undefined8 *puVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  vector<double,_std::allocator<double>_> lat_dms;
  vector<double,_std::allocator<double>_> lon_dms;
  vector<double,_std::allocator<double>_> localtime;
  CESkyCoord obs_coords;
  CESkyCoord appar_coords;
  double local_220 [2];
  double local_210;
  double local_208 [2];
  undefined8 *local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [48];
  double *local_178;
  CEDate *local_170;
  double local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  CEObservation *local_148;
  undefined8 local_140;
  double local_138;
  undefined8 local_130;
  undefined8 local_128;
  double local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  double *local_100;
  double *local_e8;
  double *local_d0 [3];
  CESkyCoord local_b8 [8];
  CEAngle local_b0 [16];
  CEAngle local_a0 [24];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  CESkyCoord local_60 [8];
  CEAngle local_58 [16];
  CEAngle local_48 [24];
  
  pCVar3 = *(CEDate **)(obs + 0x10);
  local_178 = step_size;
  if (*(long *)(obs + 8) == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = __dynamic_cast(*(long *)(obs + 8),&CEBody::typeinfo,&CEPlanet::typeinfo,0);
  }
  lVar4 = *(long *)(obs + 0x18);
  local_1f8 = *(undefined8 **)(lVar4 + 0xa8);
  local_148 = obs;
  local_1b8[0] = (undefined1 *)(**(code **)(*(long *)pCVar3 + 0x48))(pCVar3,&local_1f8);
  CETime::TimeDbl2Vect((double *)local_d0);
  local_1f8 = *(undefined8 **)(lVar4 + 8);
  CEAngle::CEAngle((CEAngle *)local_1b8,(double *)&local_1f8);
  CEAngle::DmsVect();
  CEAngle::~CEAngle((CEAngle *)local_1b8);
  local_1f8 = *(undefined8 **)(lVar4 + 0x10);
  CEAngle::CEAngle((CEAngle *)local_1b8,(double *)&local_1f8);
  CEAngle::DmsVect();
  CEAngle::~CEAngle((CEAngle *)local_1b8);
  putchar(10);
  puts("= OBSERVER ===================");
  printf("  Longitude: %+4dd %02dm %4.1fs\n",SUB84(local_e8[2] + local_e8[3],0),
         (ulong)(uint)(int)*local_e8,(ulong)(uint)(int)local_e8[1]);
  printf("  Latitude :  %+3dd %02dm %4.1fs\n",SUB84(local_100[2] + local_100[3],0),
         (ulong)(uint)(int)*local_100,(ulong)(uint)(int)local_100[1]);
  printf("  Elevation: %f m \n",(int)*(undefined8 *)(lVar4 + 0x18));
  printf("  Pressure : %f hPa\n",(int)*(undefined8 *)(lVar4 + 0x20));
  printf("  Temp     : %f Celsius\n",(int)*(undefined8 *)(lVar4 + 0x28));
  printf("  Humidity : %f %%\n",SUB84(*(double *)(lVar4 + 0x30) * 100.0,0));
  printf("  Wavelen. : %f micrometers\n",(int)*(undefined8 *)(lVar4 + 0x38));
  printf("  LocalTime: %02d:%02d:%04.1f\n",SUB84(local_d0[0][2] + local_d0[0][3],0),
         (ulong)(uint)(int)*local_d0[0],(ulong)(uint)(int)local_d0[0][1]);
  printf("  UTCOffset: %2d hrs\n\n",(ulong)(uint)(int)*(double *)(lVar4 + 0xa8));
  puts("= PLANET =====================");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,*(long *)(lVar6 + 0x30),
             *(long *)(lVar6 + 0x38) + *(long *)(lVar6 + 0x30));
  printf("  Name  : %s\n",local_1b8[0]);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  printf("  Mass  : %e kg\n",(int)*(undefined8 *)(lVar6 + 0x58));
  printf("  Radius: %f km\n",SUB84(*(double *)(lVar6 + 0x50) / 1000.0,0));
  printf("  Albedo: %f\n\n",(int)*(undefined8 *)(lVar6 + 0x60));
  puts("= NOTES ======================");
  puts("  * RA,DEC represent apparent ICRS coordinates for the observer");
  puts("  * Coordinates should be considered dubious at small altitudes");
  putchar(10);
  puts("      JD        LOCAL     RA (appar.)    DEC (appar.)     Az       Alt  ");
  puts(" =======================================================================");
  dVar1 = *duration;
  dVar2 = *local_178;
  CESkyCoord::CESkyCoord(local_b8);
  CESkyCoord::CESkyCoord(local_60);
  if ((int)(dVar1 / dVar2) < 0) {
    puVar7 = (undefined8 *)0x0;
    puVar11 = (undefined8 *)0x0;
  }
  else {
    iVar10 = (int)(dVar1 / dVar2) + 1;
    local_168 = 0.0;
    uStack_160 = 0;
    puVar8 = (undefined8 *)0x0;
    puVar9 = (undefined8 *)0x0;
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    local_170 = pCVar3;
    do {
      pCVar5 = local_148;
      local_158 = CONCAT44(uVar13,uVar12);
      uStack_150 = uVar14;
      uStack_14c = uVar15;
      local_208[0] = (double)(**(code **)(*(long *)local_148 + 0x28))(local_148);
      CEAngle::CEAngle((CEAngle *)local_1b8,local_208);
      local_220[0] = (double)(**(code **)(*(long *)pCVar5 + 0x38))(pCVar5);
      CEAngle::CEAngle((CEAngle *)&local_1f8,local_220);
      local_210 = (double)CONCAT44(local_210._4_4_,3);
      CESkyCoord::SetCoordinates
                ((CEAngle *)local_b8,(CEAngle *)local_1b8,(CESkyCoordType *)&local_1f8);
      CEAngle::~CEAngle((CEAngle *)&local_1f8);
      CEAngle::~CEAngle((CEAngle *)local_1b8);
      CESkyCoord::ConvertToICRS((CEDate *)local_1b8,(CEObserver *)local_b8);
      CESkyCoord::operator=(local_60,(CESkyCoord *)local_1b8);
      CESkyCoord::~CESkyCoord((CESkyCoord *)local_1b8);
      CEDate::CEDate((CEDate *)local_1b8,2451545.0,JD);
      local_220[0] = CEAngle::operator_cast_to_double(local_58);
      CEAngle::CEAngle((CEAngle *)local_208,local_220);
      CEAngle::HmsVect();
      puVar7 = local_1f8;
      local_78 = uStack_1f0;
      uStack_70 = uStack_1e8;
      local_1f8 = (undefined8 *)0x0;
      uStack_1f0 = 0;
      uStack_1e8 = 0;
      if (puVar8 != (undefined8 *)0x0) {
        operator_delete(puVar8);
      }
      if (local_1f8 != (undefined8 *)0x0) {
        operator_delete(local_1f8);
      }
      CEAngle::~CEAngle((CEAngle *)local_208);
      CEDate::~CEDate((CEDate *)local_1b8);
      CEDate::CEDate((CEDate *)local_1b8,2451545.0,JD);
      local_220[0] = CEAngle::operator_cast_to_double(local_48);
      CEAngle::CEAngle((CEAngle *)local_208,local_220);
      CEAngle::DmsVect();
      puVar11 = local_1f8;
      local_88 = uStack_1f0;
      uStack_80 = uStack_1e8;
      local_1f8 = (undefined8 *)0x0;
      uStack_1f0 = 0;
      uStack_1e8 = 0;
      if (puVar9 != (undefined8 *)0x0) {
        operator_delete(puVar9);
      }
      if (local_1f8 != (undefined8 *)0x0) {
        operator_delete(local_1f8);
      }
      CEAngle::~CEAngle((CEAngle *)local_208);
      CEDate::~CEDate((CEDate *)local_1b8);
      pCVar3 = local_170;
      local_168 = CEDate::operator_cast_to_double(local_170);
      local_108 = *(undefined8 *)(lVar4 + 0xa8);
      local_158 = (**(code **)(*(long *)pCVar3 + 0x48))(pCVar3);
      local_110 = *puVar7;
      local_118 = puVar7[1];
      local_120 = (double)puVar7[2] + (double)puVar7[3];
      local_128 = *puVar11;
      local_130 = puVar11[1];
      local_138 = (double)puVar11[2] + (double)puVar11[3];
      CEDate::CEDate((CEDate *)local_1b8,2451545.0,JD);
      local_1f8 = (undefined8 *)CEAngle::operator_cast_to_double(local_b0);
      CEAngle::CEAngle((CEAngle *)local_208,(double *)&local_1f8);
      local_140 = CEAngle::Deg();
      CEDate::CEDate((CEDate *)&local_1f8,2451545.0,JD);
      local_210 = CEAngle::operator_cast_to_double(local_a0);
      CEAngle::CEAngle((CEAngle *)local_220,&local_210);
      CEAngle::Deg();
      printf(" %11.2f  %08.1f  %2.0fh %2.0fm %4.1fs  %+3.0fd %2.0fm %4.1fs  %8.3f  %+7.3f\n",
             SUB84(local_168,0),local_158,local_110,local_118,local_120,local_128,local_130,
             local_138);
      CEAngle::~CEAngle((CEAngle *)local_220);
      CEDate::~CEDate((CEDate *)&local_1f8);
      CEAngle::~CEAngle((CEAngle *)local_208);
      CEDate::~CEDate((CEDate *)local_1b8);
      dVar1 = (double)(**(code **)(*(long *)pCVar3 + 0x20))(pCVar3);
      local_1b8[0] = (undefined1 *)(dVar1 + *local_178 / 1440.0);
      local_1f8 = (undefined8 *)((ulong)local_1f8 & 0xffffffff00000000);
      (**(code **)(*(long *)pCVar3 + 0x10))(pCVar3,(CEDate *)local_1b8,(CEDate *)&local_1f8);
      local_168 = (double)local_88;
      uStack_160 = uStack_80;
      iVar10 = iVar10 + -1;
      puVar8 = puVar7;
      puVar9 = puVar11;
      uVar12 = (undefined4)local_78;
      uVar13 = local_78._4_4_;
      uVar14 = (undefined4)uStack_70;
      uVar15 = uStack_70._4_4_;
    } while (iVar10 != 0);
  }
  puts(" -------------------------------------------------------------------");
  CESkyCoord::~CESkyCoord(local_60);
  CESkyCoord::~CESkyCoord(local_b8);
  if (puVar11 != (undefined8 *)0x0) {
    operator_delete(puVar11);
  }
  if (puVar7 != (undefined8 *)0x0) {
    operator_delete(puVar7);
  }
  if (local_100 != (double *)0x0) {
    operator_delete(local_100);
  }
  if (local_e8 != (double *)0x0) {
    operator_delete(local_e8);
  }
  if (local_d0[0] != (double *)0x0) {
    operator_delete(local_d0[0]);
  }
  return;
}

Assistant:

void PrintEphemeris(CEObservation& obs, 
                    const double&  duration, 
                    const double&  step_size)
{
    // Lets get the objects in obs
    CEDate* date = obs.Date();
    CEPlanet* planet = dynamic_cast<CEPlanet*>( obs.Body() );
    CEObserver* observer = obs.Observer();
    std::vector<double> localtime = CETime::TimeDbl2Vect(date->GetTime(observer->UTCOffset()));
    
    // Print some information about the observer
    std::vector<double> lon_dms = CEAngle(observer->Longitude_Rad()).DmsVect();
    std::vector<double> lat_dms = CEAngle(observer->Latitude_Rad()).DmsVect();

    std::printf("\n") ;
    std::printf("= OBSERVER ===================\n");
    std::printf("  Longitude: %+4dd %02dm %4.1fs\n", int(lon_dms[0]), int(lon_dms[1]), lon_dms[2]+lon_dms[3]);
    std::printf("  Latitude :  %+3dd %02dm %4.1fs\n", int(lat_dms[0]), int(lat_dms[1]), lat_dms[2]+lat_dms[3]);
    std::printf("  Elevation: %f m \n", observer->Elevation_m());
    std::printf("  Pressure : %f hPa\n", observer->Pressure_hPa());
    std::printf("  Temp     : %f Celsius\n", observer->Temperature_C());
    std::printf("  Humidity : %f %%\n", 100.0*observer->RelativeHumidity());
    std::printf("  Wavelen. : %f micrometers\n", observer->Wavelength_um());
    std::printf("  LocalTime: %02d:%02d:%04.1f\n", int(localtime[0]), int(localtime[1]), localtime[2]+localtime[3]);
    std::printf("  UTCOffset: %2d hrs\n\n", int(observer->UTCOffset()));

    // Print some basic information regarding the planet itself
    std::printf("= PLANET =====================\n");
    std::printf("  Name  : %s\n", planet->Name().c_str());
    std::printf("  Mass  : %e kg\n", planet->Mass_kg());
    std::printf("  Radius: %f km\n", planet->Radius_m()/1000.0);
    std::printf("  Albedo: %f\n\n", planet->Albedo());
    
    std::vector<double> ra;
    std::vector<double> dec;
    
    // Now do the stuff we actually want
    std::printf("= NOTES ======================\n");
    std::printf("  * RA,DEC represent apparent ICRS coordinates for the observer\n");
    std::printf("  * Coordinates should be considered dubious at small altitudes\n");
    std::printf("\n");
    std::printf("      JD        LOCAL     RA (appar.)    DEC (appar.)     Az       Alt  \n") ;
    std::printf(" =======================================================================\n") ;
    int max_steps = int(duration/step_size);
    CESkyCoord obs_coords;
    CESkyCoord appar_coords;
    for (int s=0; s<=max_steps; s++) {

        // Get the observed coordinates
        obs_coords.SetCoordinates(obs.GetAzimuth_Rad(), obs.GetZenith_Rad(),
                                  CESkyCoordType::OBSERVED);
        // Convert to RA,DEC
        appar_coords = obs_coords.ConvertToICRS(*date, *observer);
        // Update the coordiantes of the planet
        ra  = appar_coords.XCoord().HmsVect();
        dec = appar_coords.YCoord().DmsVect();
        
        std::printf(" %11.2f  %08.1f  %2.0fh %2.0fm %4.1fs  %+3.0fd %2.0fm %4.1fs  %8.3f  %+7.3f\n",
                    double(*date), date->GetTime(observer->UTCOffset()),
                    ra[0], ra[1], ra[2] + ra[3],
                    dec[0], dec[1], dec[2] + dec[3],
                    obs_coords.XCoord().Deg(),
                    90.0-obs_coords.YCoord().Deg());
        
        // Update the date
        date->SetDate(date->JD() + step_size/(60.0*24.0), CEDateType::JD);
    }
    
    std::printf(" -------------------------------------------------------------------\n");
}